

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O2

XXH128_hash_t
XXH128_mix32B(XXH128_hash_t acc,xxh_u8 *input_1,xxh_u8 *input_2,xxh_u8 *secret,XXH64_hash_t seed)

{
  long lVar1;
  long lVar2;
  xxh_u64 xVar3;
  xxh_u64 xVar4;
  XXH128_hash_t XVar5;
  
  xVar3 = XXH3_mix16B(input_1,secret,seed);
  lVar1 = *(long *)(input_2 + 8);
  lVar2 = *(long *)input_2;
  xVar4 = XXH3_mix16B(input_2,secret + 0x10,seed);
  XVar5.high64 = *(long *)(input_1 + 8) + *(long *)input_1 ^ acc.high64 + xVar4;
  XVar5.low64 = xVar3 + acc.low64 ^ lVar1 + lVar2;
  return XVar5;
}

Assistant:

XXH_FORCE_INLINE XXH128_hash_t
XXH128_mix32B(XXH128_hash_t acc, const xxh_u8* input_1, const xxh_u8* input_2,
              const xxh_u8* secret, XXH64_hash_t seed)
{
    acc.low64  += XXH3_mix16B (input_1, secret+0, seed);
    acc.low64  ^= XXH_readLE64(input_2) + XXH_readLE64(input_2 + 8);
    acc.high64 += XXH3_mix16B (input_2, secret+16, seed);
    acc.high64 ^= XXH_readLE64(input_1) + XXH_readLE64(input_1 + 8);
    return acc;
}